

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraCodeBlocksGenerator.cxx
# Opt level: O0

void __thiscall
cmExtraCodeBlocksGenerator::CreateNewProjectFile
          (cmExtraCodeBlocksGenerator *this,
          vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *lgs,string *filename)

{
  pointer *ppbVar1;
  cmLocalGenerator *pcVar2;
  cmSourceFile *this_00;
  CbpUnit *this_01;
  pointer this_02;
  undefined8 uVar3;
  byte bVar4;
  bool bVar5;
  __type _Var6;
  TargetType TVar7;
  const_reference ppcVar8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>_>_>
  *this_03;
  pointer this_04;
  const_iterator __first;
  const_iterator __last;
  reference pbVar9;
  string *psVar10;
  char *pcVar11;
  char *pcVar12;
  string *__rhs;
  cmake *pcVar13;
  reference ppcVar14;
  cmMakefile *pcVar15;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *pvVar16;
  reference ppcVar17;
  reference ppcVar18;
  cmMakefile *this_05;
  long lVar19;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar20;
  mapped_type *pmVar21;
  mapped_type *this_06;
  reference ppcVar22;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a48;
  allocator<char> local_a21;
  string local_a20;
  cmGeneratorTarget *local_a00;
  cmGeneratorTarget *tgt;
  const_iterator __end2_5;
  const_iterator __begin2_5;
  vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_> *__range2_5;
  string local_9d8;
  CbpUnit *local_9b8;
  CbpUnit *unit;
  string *unitFilename;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>
  *s_1;
  iterator __end1_4;
  iterator __begin1_4;
  all_files_map_t *__range1_4;
  _Self local_980;
  undefined1 local_978 [8];
  string hname;
  string *ext;
  const_iterator __end2_4;
  const_iterator __begin2_4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2_4;
  undefined1 local_918 [8];
  string headerBasename;
  string *fileName_1;
  iterator __end1_3;
  iterator __begin1_3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1_3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *headerExts;
  CbpUnit *cbpUnit;
  string local_8c0;
  undefined1 local_899;
  undefined1 local_898 [7];
  bool excludeExternal_1;
  char *local_878;
  string *relative_1;
  string *fullPath;
  string *srcext;
  string lang;
  bool isCFile;
  cmSourceFile *s;
  iterator __end4;
  iterator __begin4;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *__range4;
  string local_810;
  cmGeneratorTarget *local_7f0;
  cmGeneratorTarget *gt_1;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> sources;
  cmGeneratorTarget *target_1;
  const_iterator __end2_3;
  const_iterator __begin2_3;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *__range2_3;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *targets_1;
  cmMakefile *makefile;
  cmLocalGenerator *lg_2;
  const_iterator __end1_2;
  const_iterator __begin1_2;
  vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *__range1_2;
  cmake *cm;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cFiles;
  all_files_map_t allFiles;
  string fastTarget;
  cmGeneratorTarget *gt;
  string targetName;
  cmGeneratorTarget *target;
  const_iterator __end2_2;
  const_iterator __begin2_2;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *__range2_2;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *targets;
  cmLocalGenerator *lg_1;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *__range1_1;
  string local_698;
  allocator<char> local_671;
  string local_670;
  allocator<char> local_649;
  string local_648;
  int local_628;
  allocator<char> local_621;
  string local_620;
  string local_600;
  allocator<char> local_5d9;
  string local_5d8;
  allocator<char> local_5b1;
  string local_5b0;
  int local_58c [2];
  allocator<char> local_581;
  string local_580;
  allocator<char> local_559;
  string local_558;
  undefined1 local_538 [8];
  cmXMLWriter xml;
  string local_4d8;
  string *local_4b8;
  string *makeArgs;
  string local_4a8;
  string *local_488;
  string *make;
  string compiler;
  string local_458;
  byte local_431;
  iterator iStack_430;
  bool excludeExternal;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_428;
  const_iterator local_420;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_418;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_410;
  const_iterator local_408;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_400;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_3f8;
  undefined1 local_3f0 [8];
  string fileName;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  splitted;
  string *relative;
  string *listFile;
  iterator __end2_1;
  iterator __begin2_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2_1;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_358;
  const_iterator local_350;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_348;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *files;
  cmLocalGenerator *lg;
  const_iterator __end2;
  const_iterator __begin2;
  vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *__range2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  listFiles;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
  *it;
  const_iterator __end1;
  const_iterator __begin1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>_>_>
  *__range1;
  Tree tree;
  undefined1 local_270 [8];
  cmGeneratedFileStream fout;
  cmMakefile *mf;
  string *filename_local;
  vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *lgs_local;
  cmExtraCodeBlocksGenerator *this_local;
  
  ppcVar8 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::operator[](lgs,0);
  fout._576_8_ = cmLocalGenerator::GetMakefile(*ppcVar8);
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)local_270,filename,false,None);
  bVar4 = std::ios::operator!((ios *)(local_270 + (long)*(_func_int **)((long)local_270 + -0x18)));
  if ((bVar4 & 1) == 0) {
    Tree::Tree((Tree *)&__range1);
    this_03 = cmGlobalGenerator::GetProjectMap_abi_cxx11_
                        ((this->super_cmExternalMakefileProjectGenerator).GlobalGenerator);
    __end1 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>_>_>
             ::begin(this_03);
    it = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
          *)std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>_>_>
            ::end(this_03);
    while (bVar5 = std::operator!=(&__end1,(_Self *)&it), bVar5) {
      listFiles.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           &std::
            _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>_>
            ::operator*(&__end1)->first;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&__range2);
      this_04 = listFiles.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage + 1;
      __end2 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::begin
                         ((vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *)this_04
                         );
      lg = (cmLocalGenerator *)
           std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::end
                     ((vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *)this_04);
      while (bVar5 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
                                         *)&lg), bVar5) {
        ppcVar14 = __gnu_cxx::
                   __normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
                   ::operator*(&__end2);
        files = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)*ppcVar14;
        pcVar15 = cmLocalGenerator::GetMakefile((cmLocalGenerator *)files);
        local_348 = cmMakefile::GetListFiles_abi_cxx11_(pcVar15);
        local_358._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&__range2);
        __gnu_cxx::
        __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
        ::__normal_iterator<std::__cxx11::string*>
                  ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                    *)&local_350,&local_358);
        __first = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::begin(local_348);
        __last = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end(local_348);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&__range2,
                   local_350,
                   (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    )__first._M_current,
                   (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    )__last._M_current);
        __gnu_cxx::
        __normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
        ::operator++(&__end2);
      }
      __end2_1 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&__range2);
      listFile = (string *)
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&__range2);
      while (bVar5 = __gnu_cxx::operator!=
                               (&__end2_1,
                                (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)&listFile), bVar5) {
        pbVar9 = __gnu_cxx::
                 __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&__end2_1);
        psVar10 = cmSystemTools::GetCMakeRoot_abi_cxx11_();
        lVar19 = std::__cxx11::string::find((string *)pbVar9,(ulong)psVar10);
        if (lVar19 != 0) {
          ppcVar8 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::operator[]
                              ((vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *)
                               (listFiles.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage + 1),0);
          psVar10 = cmLocalGenerator::GetSourceDirectory_abi_cxx11_(*ppcVar8);
          cmSystemTools::RelativePath
                    ((string *)
                     &splitted.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,psVar10,pbVar9);
          ppbVar1 = &splitted.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
          pvVar20 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)((long)&fileName.field_2 + 8);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector(pvVar20);
          cmsys::SystemTools::SplitPath((string *)ppbVar1,pvVar20,false);
          local_400._M_current =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)((long)&fileName.field_2 + 8));
          local_3f8 = __gnu_cxx::
                      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator-(&local_400,1);
          pbVar9 = __gnu_cxx::
                   __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*(&local_3f8);
          std::__cxx11::string::string((string *)local_3f0,(string *)pbVar9);
          pvVar20 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)(&fileName.field_2._M_allocated_capacity + 1);
          local_418._M_current =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end(pvVar20);
          local_410 = __gnu_cxx::
                      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator-(&local_418,1);
          __gnu_cxx::
          __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
          ::__normal_iterator<std::__cxx11::string*>
                    ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                      *)&local_408,&local_410);
          local_428._M_current =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end(pvVar20);
          __gnu_cxx::
          __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
          ::__normal_iterator<std::__cxx11::string*>
                    ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                      *)&local_420,&local_428);
          iStack_430 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::erase(pvVar20,local_408,local_420);
          ppcVar8 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::operator[]
                              ((vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *)
                               (listFiles.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage + 1),0);
          pcVar15 = cmLocalGenerator::GetMakefile(*ppcVar8);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_458,"CMAKE_CODEBLOCKS_EXCLUDE_EXTERNAL_FILES",
                     (allocator<char> *)(compiler.field_2._M_local_buf + 0xf));
          psVar10 = cmMakefile::GetSafeDefinition(pcVar15,&local_458);
          bVar5 = cmSystemTools::IsOn(psVar10);
          std::__cxx11::string::~string((string *)&local_458);
          std::allocator<char>::~allocator((allocator<char> *)(compiler.field_2._M_local_buf + 0xf))
          ;
          local_431 = bVar5;
          bVar5 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)((long)&fileName.field_2 + 8));
          if ((!bVar5) &&
             ((((local_431 & 1) == 0 ||
               (lVar19 = std::__cxx11::string::find((char *)ppbVar1,0x87bc6e), lVar19 == -1)) &&
              (lVar19 = std::__cxx11::string::find((char *)ppbVar1,0x848826), lVar19 == -1)))) {
            Tree::InsertPath((Tree *)&__range1,
                             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)((long)&fileName.field_2 + 8),1,(string *)local_3f0);
          }
          std::__cxx11::string::~string((string *)local_3f0);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)((long)&fileName.field_2 + 8));
          std::__cxx11::string::~string
                    ((string *)
                     &splitted.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end2_1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&__range2);
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>_>
      ::operator++(&__end1);
    }
    GetCBCompilerId_abi_cxx11_((string *)&make,this,(cmMakefile *)fout._576_8_);
    uVar3 = fout._576_8_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_4a8,"CMAKE_MAKE_PROGRAM",(allocator<char> *)((long)&makeArgs + 7));
    psVar10 = cmMakefile::GetRequiredDefinition((cmMakefile *)uVar3,&local_4a8);
    std::__cxx11::string::~string((string *)&local_4a8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&makeArgs + 7));
    uVar3 = fout._576_8_;
    local_488 = psVar10;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_4d8,"CMAKE_CODEBLOCKS_MAKE_ARGUMENTS",
               (allocator<char> *)&xml.field_0x57);
    psVar10 = cmMakefile::GetSafeDefinition((cmMakefile *)uVar3,&local_4d8);
    std::__cxx11::string::~string((string *)&local_4d8);
    std::allocator<char>::~allocator((allocator<char> *)&xml.field_0x57);
    local_4b8 = psVar10;
    cmXMLWriter::cmXMLWriter((cmXMLWriter *)local_538,(ostream *)local_270,0);
    cmXMLWriter::StartDocument((cmXMLWriter *)local_538,"UTF-8");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_558,"CodeBlocks_project_file",&local_559);
    cmXMLWriter::StartElement((cmXMLWriter *)local_538,&local_558);
    std::__cxx11::string::~string((string *)&local_558);
    std::allocator<char>::~allocator(&local_559);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_580,"FileVersion",&local_581);
    cmXMLWriter::StartElement((cmXMLWriter *)local_538,&local_580);
    std::__cxx11::string::~string((string *)&local_580);
    std::allocator<char>::~allocator(&local_581);
    local_58c[1] = 1;
    cmXMLWriter::Attribute<int>((cmXMLWriter *)local_538,"major",local_58c + 1);
    local_58c[0] = 6;
    cmXMLWriter::Attribute<int>((cmXMLWriter *)local_538,"minor",local_58c);
    cmXMLWriter::EndElement((cmXMLWriter *)local_538);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_5b0,"Project",&local_5b1);
    cmXMLWriter::StartElement((cmXMLWriter *)local_538,&local_5b0);
    std::__cxx11::string::~string((string *)&local_5b0);
    std::allocator<char>::~allocator(&local_5b1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_5d8,"Option",&local_5d9);
    cmXMLWriter::StartElement((cmXMLWriter *)local_538,&local_5d8);
    std::__cxx11::string::~string((string *)&local_5d8);
    std::allocator<char>::~allocator(&local_5d9);
    ppcVar8 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::operator[]
                        (lgs,0);
    cmLocalGenerator::GetProjectName_abi_cxx11_(&local_600,*ppcVar8);
    cmXMLWriter::Attribute<std::__cxx11::string>((cmXMLWriter *)local_538,"title",&local_600);
    std::__cxx11::string::~string((string *)&local_600);
    cmXMLWriter::EndElement((cmXMLWriter *)local_538);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_620,"Option",&local_621);
    cmXMLWriter::StartElement((cmXMLWriter *)local_538,&local_620);
    std::__cxx11::string::~string((string *)&local_620);
    std::allocator<char>::~allocator(&local_621);
    local_628 = 1;
    cmXMLWriter::Attribute<int>((cmXMLWriter *)local_538,"makefile_is_custom",&local_628);
    cmXMLWriter::EndElement((cmXMLWriter *)local_538);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_648,"Option",&local_649);
    cmXMLWriter::StartElement((cmXMLWriter *)local_538,&local_648);
    std::__cxx11::string::~string((string *)&local_648);
    std::allocator<char>::~allocator(&local_649);
    cmXMLWriter::Attribute<std::__cxx11::string>
              ((cmXMLWriter *)local_538,"compiler",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&make);
    cmXMLWriter::EndElement((cmXMLWriter *)local_538);
    Tree::BuildVirtualFolder((Tree *)&__range1,(cmXMLWriter *)local_538);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_670,"Build",&local_671);
    cmXMLWriter::StartElement((cmXMLWriter *)local_538,&local_670);
    std::__cxx11::string::~string((string *)&local_670);
    std::allocator<char>::~allocator(&local_671);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_698,"all",(allocator<char> *)((long)&__range1_1 + 7));
    pcVar11 = (char *)std::__cxx11::string::c_str();
    ppcVar8 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::operator[]
                        (lgs,0);
    pcVar2 = *ppcVar8;
    pcVar12 = (char *)std::__cxx11::string::c_str();
    AppendTarget(this,(cmXMLWriter *)local_538,&local_698,(cmGeneratorTarget *)0x0,pcVar11,pcVar2,
                 pcVar12,local_4b8);
    std::__cxx11::string::~string((string *)&local_698);
    std::allocator<char>::~allocator((allocator<char> *)((long)&__range1_1 + 7));
    __end1_1 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::begin(lgs);
    lg_1 = (cmLocalGenerator *)
           std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::end(lgs);
    while (bVar5 = __gnu_cxx::operator!=
                             (&__end1_1,
                              (__normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
                               *)&lg_1), bVar5) {
      ppcVar14 = __gnu_cxx::
                 __normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
                 ::operator*(&__end1_1);
      pcVar2 = *ppcVar14;
      pvVar16 = cmLocalGenerator::GetGeneratorTargets(pcVar2);
      __end2_2 = std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::begin
                           (pvVar16);
      target = (cmGeneratorTarget *)
               std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::end(pvVar16);
      while (bVar5 = __gnu_cxx::operator!=
                               (&__end2_2,
                                (__normal_iterator<cmGeneratorTarget_*const_*,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
                                 *)&target), bVar5) {
        ppcVar17 = __gnu_cxx::
                   __normal_iterator<cmGeneratorTarget_*const_*,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
                   ::operator*(&__end2_2);
        targetName.field_2._8_8_ = *ppcVar17;
        psVar10 = cmGeneratorTarget::GetName_abi_cxx11_
                            ((cmGeneratorTarget *)targetName.field_2._8_8_);
        std::__cxx11::string::string((string *)&gt,(string *)psVar10);
        TVar7 = cmGeneratorTarget::GetType((cmGeneratorTarget *)targetName.field_2._8_8_);
        uVar3 = targetName.field_2._8_8_;
        if (TVar7 < UTILITY) {
          pcVar11 = (char *)std::__cxx11::string::c_str();
          pcVar12 = (char *)std::__cxx11::string::c_str();
          AppendTarget(this,(cmXMLWriter *)local_538,(string *)&gt,(cmGeneratorTarget *)uVar3,
                       pcVar11,pcVar2,pcVar12,local_4b8);
          std::__cxx11::string::string
                    ((string *)&allFiles._M_t._M_impl.super__Rb_tree_header._M_node_count,
                     (string *)&gt);
          std::__cxx11::string::operator+=
                    ((string *)&allFiles._M_t._M_impl.super__Rb_tree_header._M_node_count,"/fast");
          pcVar11 = (char *)std::__cxx11::string::c_str();
          pcVar12 = (char *)std::__cxx11::string::c_str();
          AppendTarget(this,(cmXMLWriter *)local_538,
                       (string *)&allFiles._M_t._M_impl.super__Rb_tree_header._M_node_count,
                       (cmGeneratorTarget *)uVar3,pcVar11,pcVar2,pcVar12,local_4b8);
          std::__cxx11::string::~string
                    ((string *)&allFiles._M_t._M_impl.super__Rb_tree_header._M_node_count);
        }
        else if (TVar7 == UTILITY) {
          lVar19 = std::__cxx11::string::find((char *)&gt,0x84516b);
          if ((((lVar19 != 0) ||
               (bVar5 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)&gt,"Nightly"), !bVar5)) &&
              ((lVar19 = std::__cxx11::string::find((char *)&gt,0x845067), lVar19 != 0 ||
               (bVar5 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)&gt,"Continuous"), !bVar5)))) &&
             ((lVar19 = std::__cxx11::string::find((char *)&gt,0x8450e6), lVar19 != 0 ||
              (bVar5 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&gt,"Experimental"), !bVar5)))) {
            pcVar11 = (char *)std::__cxx11::string::c_str();
            pcVar12 = (char *)std::__cxx11::string::c_str();
            AppendTarget(this,(cmXMLWriter *)local_538,(string *)&gt,(cmGeneratorTarget *)0x0,
                         pcVar11,pcVar2,pcVar12,local_4b8);
          }
        }
        else if (TVar7 == GLOBAL_TARGET) {
          psVar10 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(pcVar2);
          __rhs = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_(pcVar2);
          _Var6 = std::operator==(psVar10,__rhs);
          if (_Var6) {
            pcVar11 = (char *)std::__cxx11::string::c_str();
            pcVar12 = (char *)std::__cxx11::string::c_str();
            AppendTarget(this,(cmXMLWriter *)local_538,(string *)&gt,(cmGeneratorTarget *)0x0,
                         pcVar11,pcVar2,pcVar12,local_4b8);
          }
        }
        std::__cxx11::string::~string((string *)&gt);
        __gnu_cxx::
        __normal_iterator<cmGeneratorTarget_*const_*,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
        ::operator++(&__end2_2);
      }
      __gnu_cxx::
      __normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
      ::operator++(&__end1_1);
    }
    cmXMLWriter::EndElement((cmXMLWriter *)local_538);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>_>
           *)&cFiles.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&cm);
    pcVar13 = cmGlobalGenerator::GetCMakeInstance
                        ((this->super_cmExternalMakefileProjectGenerator).GlobalGenerator);
    __end1_2 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::begin(lgs);
    lg_2 = (cmLocalGenerator *)
           std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::end(lgs);
    while (bVar5 = __gnu_cxx::operator!=
                             (&__end1_2,
                              (__normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
                               *)&lg_2), bVar5) {
      ppcVar14 = __gnu_cxx::
                 __normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
                 ::operator*(&__end1_2);
      pcVar2 = *ppcVar14;
      pcVar15 = cmLocalGenerator::GetMakefile(pcVar2);
      pvVar16 = cmLocalGenerator::GetGeneratorTargets(pcVar2);
      __end2_3 = std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::begin
                           (pvVar16);
      target_1 = (cmGeneratorTarget *)
                 std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::end
                           (pvVar16);
      while (bVar5 = __gnu_cxx::operator!=
                               (&__end2_3,
                                (__normal_iterator<cmGeneratorTarget_*const_*,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
                                 *)&target_1), bVar5) {
        ppcVar17 = __gnu_cxx::
                   __normal_iterator<cmGeneratorTarget_*const_*,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
                   ::operator*(&__end2_3);
        sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)*ppcVar17;
        TVar7 = cmGeneratorTarget::GetType
                          ((cmGeneratorTarget *)
                           sources.
                           super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage);
        if (TVar7 < GLOBAL_TARGET) {
          std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::vector
                    ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)&gt_1);
          this_02 = sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage;
          local_7f0 = (cmGeneratorTarget *)
                      sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_810,"CMAKE_BUILD_TYPE",
                     (allocator<char> *)((long)&__range4 + 7));
          psVar10 = cmMakefile::GetSafeDefinition(pcVar15,&local_810);
          cmGeneratorTarget::GetSourceFiles
                    ((cmGeneratorTarget *)this_02,
                     (vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)&gt_1,psVar10);
          std::__cxx11::string::~string((string *)&local_810);
          std::allocator<char>::~allocator((allocator<char> *)((long)&__range4 + 7));
          __end4 = std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::begin
                             ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)&gt_1);
          s = (cmSourceFile *)
              std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::end
                        ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)&gt_1);
          while (bVar5 = __gnu_cxx::operator!=
                                   (&__end4,(__normal_iterator<cmSourceFile_**,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
                                             *)&s), bVar5) {
            ppcVar18 = __gnu_cxx::
                       __normal_iterator<cmSourceFile_**,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
                       ::operator*(&__end4);
            this_00 = *ppcVar18;
            TVar7 = cmGeneratorTarget::GetType(local_7f0);
            if ((TVar7 != UTILITY) || (bVar5 = cmSourceFile::GetIsGenerated(this_00), !bVar5)) {
              lang.field_2._M_local_buf[0xf] = '\0';
              cmSourceFile::GetLanguage_abi_cxx11_((string *)&srcext,this_00);
              bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&srcext,"C");
              if ((bVar5) ||
                 ((bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)&srcext,"CXX"), bVar5 ||
                  (bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)&srcext,"CUDA"), bVar5)))) {
                fullPath = cmSourceFile::GetExtension_abi_cxx11_(this_00);
                lang.field_2._M_local_buf[0xf] = cmake::IsSourceExtension(pcVar13,fullPath);
              }
              relative_1 = cmSourceFile::GetFullPath(this_00,(string *)0x0);
              psVar10 = cmLocalGenerator::GetSourceDirectory_abi_cxx11_(pcVar2);
              cmSystemTools::RelativePath((string *)local_898,psVar10,relative_1);
              local_878 = local_898;
              this_05 = cmLocalGenerator::GetMakefile(pcVar2);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_8c0,"CMAKE_CODEBLOCKS_EXCLUDE_EXTERNAL_FILES",
                         (allocator<char> *)((long)&cbpUnit + 7));
              psVar10 = cmMakefile::GetSafeDefinition(this_05,&local_8c0);
              bVar5 = cmSystemTools::IsOn(psVar10);
              std::__cxx11::string::~string((string *)&local_8c0);
              std::allocator<char>::~allocator((allocator<char> *)((long)&cbpUnit + 7));
              local_899 = bVar5;
              if ((bVar5) && (lVar19 = std::__cxx11::string::find(local_878,0x87bc6e), lVar19 != -1)
                 ) {
                tree.files._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 0x13;
              }
              else {
                if ((lang.field_2._M_local_buf[0xf] & 1U) != 0) {
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&cm,relative_1);
                }
                pmVar21 = std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>_>
                          ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>_>
                                        *)&cFiles.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                       relative_1);
                std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>::
                push_back(&pmVar21->Targets,
                          (value_type *)
                          &sources.
                           super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage);
                tree.files._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 0;
              }
              std::__cxx11::string::~string((string *)local_898);
              std::__cxx11::string::~string((string *)&srcext);
            }
            __gnu_cxx::
            __normal_iterator<cmSourceFile_**,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
            ::operator++(&__end4);
          }
          std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::~vector
                    ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)&gt_1);
        }
        __gnu_cxx::
        __normal_iterator<cmGeneratorTarget_*const_*,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
        ::operator++(&__end2_3);
      }
      __gnu_cxx::
      __normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
      ::operator++(&__end1_2);
    }
    pcVar13 = cmGlobalGenerator::GetCMakeInstance
                        ((this->super_cmExternalMakefileProjectGenerator).GlobalGenerator);
    pvVar20 = cmake::GetHeaderExtensions_abi_cxx11_(pcVar13);
    __end1_3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&cm);
    fileName_1 = (string *)
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&cm);
    while (bVar5 = __gnu_cxx::operator!=
                             (&__end1_3,
                              (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)&fileName_1), bVar5) {
      headerBasename.field_2._8_8_ =
           __gnu_cxx::
           __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator*(&__end1_3);
      cmsys::SystemTools::GetFilenamePath
                ((string *)local_918,(string *)headerBasename.field_2._8_8_);
      std::__cxx11::string::operator+=((string *)local_918,"/");
      cmsys::SystemTools::GetFilenameWithoutExtension
                ((string *)&__range2_4,(string *)headerBasename.field_2._8_8_);
      std::__cxx11::string::operator+=((string *)local_918,(string *)&__range2_4);
      std::__cxx11::string::~string((string *)&__range2_4);
      __end2_4 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin(pvVar20);
      ext = (string *)
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::end(pvVar20);
      while (bVar5 = __gnu_cxx::operator!=
                               (&__end2_4,
                                (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)&ext), bVar5) {
        hname.field_2._8_8_ =
             __gnu_cxx::
             __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&__end2_4);
        std::__cxx11::string::string((string *)local_978,(string *)local_918);
        std::__cxx11::string::operator+=((string *)local_978,".");
        std::__cxx11::string::operator+=((string *)local_978,(string *)hname.field_2._8_8_);
        local_980._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>_>
             ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>_>
                     *)&cFiles.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,(key_type *)local_978);
        __range1_4 = (all_files_map_t *)
                     std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>_>
                     ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>_>
                            *)&cFiles.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
        bVar5 = std::operator!=(&local_980,(_Self *)&__range1_4);
        if (bVar5) {
          tree.files._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 0x16;
        }
        else {
          bVar5 = cmsys::SystemTools::FileExists((string *)local_978);
          if (bVar5) {
            pmVar21 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>_>
                      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>_>
                                    *)&cFiles.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                   (key_type *)headerBasename.field_2._8_8_);
            this_06 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>_>
                      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>_>
                                    *)&cFiles.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                   (key_type *)local_978);
            std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>::
            operator=(&this_06->Targets,&pmVar21->Targets);
            tree.files._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 0x16;
          }
          else {
            tree.files._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 0;
          }
        }
        std::__cxx11::string::~string((string *)local_978);
        if ((int)tree.files._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) break;
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end2_4);
      }
      std::__cxx11::string::~string((string *)local_918);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end1_3);
    }
    ppbVar1 = &cFiles.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    __end1_4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>_>
               ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>_>
                        *)ppbVar1);
    s_1 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>
           *)std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>_>
             ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>_>
                    *)ppbVar1);
    while (bVar5 = std::operator!=(&__end1_4,(_Self *)&s_1), bVar5) {
      unit = (CbpUnit *)
             std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>
             ::operator*(&__end1_4);
      local_9b8 = &((reference)unit)->second;
      unitFilename = (string *)unit;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_9d8,"Unit",(allocator<char> *)((long)&__range2_5 + 7));
      cmXMLWriter::StartElement((cmXMLWriter *)local_538,&local_9d8);
      std::__cxx11::string::~string((string *)&local_9d8);
      std::allocator<char>::~allocator((allocator<char> *)((long)&__range2_5 + 7));
      cmXMLWriter::Attribute<std::__cxx11::string>
                ((cmXMLWriter *)local_538,"filename",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit);
      this_01 = local_9b8;
      __end2_5 = std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                 ::begin(&local_9b8->Targets);
      tgt = (cmGeneratorTarget *)
            std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>::end
                      (&this_01->Targets);
      while (bVar5 = __gnu_cxx::operator!=
                               (&__end2_5,
                                (__normal_iterator<const_cmGeneratorTarget_*const_*,_std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>_>
                                 *)&tgt), bVar5) {
        ppcVar22 = __gnu_cxx::
                   __normal_iterator<const_cmGeneratorTarget_*const_*,_std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>_>
                   ::operator*(&__end2_5);
        local_a00 = *ppcVar22;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_a20,"Option",&local_a21)
        ;
        cmXMLWriter::StartElement((cmXMLWriter *)local_538,&local_a20);
        std::__cxx11::string::~string((string *)&local_a20);
        std::allocator<char>::~allocator(&local_a21);
        psVar10 = cmGeneratorTarget::GetName_abi_cxx11_(local_a00);
        cmXMLWriter::Attribute<std::__cxx11::string>((cmXMLWriter *)local_538,"target",psVar10);
        cmXMLWriter::EndElement((cmXMLWriter *)local_538);
        __gnu_cxx::
        __normal_iterator<const_cmGeneratorTarget_*const_*,_std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>_>
        ::operator++(&__end2_5);
      }
      cmXMLWriter::EndElement((cmXMLWriter *)local_538);
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>
      ::operator++(&__end1_4);
    }
    psVar10 = cmMakefile::GetHomeDirectory_abi_cxx11_((cmMakefile *)fout._576_8_);
    std::__cxx11::string::string((string *)&local_a68,(string *)psVar10);
    std::operator+(&local_a48,&local_a68,"/");
    Tree::BuildUnit((Tree *)&__range1,(cmXMLWriter *)local_538,&local_a48);
    std::__cxx11::string::~string((string *)&local_a48);
    std::__cxx11::string::~string((string *)&local_a68);
    cmXMLWriter::EndElement((cmXMLWriter *)local_538);
    cmXMLWriter::EndElement((cmXMLWriter *)local_538);
    cmXMLWriter::EndDocument((cmXMLWriter *)local_538);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&cm);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>_>
            *)&cFiles.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
    cmXMLWriter::~cmXMLWriter((cmXMLWriter *)local_538);
    std::__cxx11::string::~string((string *)&make);
    Tree::~Tree((Tree *)&__range1);
    tree.files._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 0;
  }
  else {
    tree.files._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 1;
  }
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_270);
  return;
}

Assistant:

void cmExtraCodeBlocksGenerator::CreateNewProjectFile(
  const std::vector<cmLocalGenerator*>& lgs, const std::string& filename)
{
  const cmMakefile* mf = lgs[0]->GetMakefile();
  cmGeneratedFileStream fout(filename);
  if (!fout) {
    return;
  }

  Tree tree;

  // build tree of virtual folders
  for (auto const& it : this->GlobalGenerator->GetProjectMap()) {
    // Collect all files
    std::vector<std::string> listFiles;
    for (cmLocalGenerator* lg : it.second) {
      const std::vector<std::string>& files =
        lg->GetMakefile()->GetListFiles();
      listFiles.insert(listFiles.end(), files.begin(), files.end());
    }

    // Convert
    for (std::string const& listFile : listFiles) {
      // don't put cmake's own files into the project (#12110):
      if (listFile.find(cmSystemTools::GetCMakeRoot()) == 0) {
        continue;
      }

      const std::string& relative = cmSystemTools::RelativePath(
        it.second[0]->GetSourceDirectory(), listFile);
      std::vector<std::string> splitted;
      cmSystemTools::SplitPath(relative, splitted, false);
      // Split filename from path
      std::string fileName = *(splitted.end() - 1);
      splitted.erase(splitted.end() - 1, splitted.end());

      // We don't want paths with CMakeFiles in them
      // or do we?
      // In speedcrunch those where purely internal
      //
      // Also we can disable external (outside the project) files by setting ON
      // CMAKE_CODEBLOCKS_EXCLUDE_EXTERNAL_FILES variable.
      const bool excludeExternal =
        cmSystemTools::IsOn(it.second[0]->GetMakefile()->GetSafeDefinition(
          "CMAKE_CODEBLOCKS_EXCLUDE_EXTERNAL_FILES"));
      if (!splitted.empty() &&
          (!excludeExternal || (relative.find("..") == std::string::npos)) &&
          relative.find("CMakeFiles") == std::string::npos) {
        tree.InsertPath(splitted, 1, fileName);
      }
    }
  }

  // figure out the compiler
  std::string compiler = this->GetCBCompilerId(mf);
  const std::string& make = mf->GetRequiredDefinition("CMAKE_MAKE_PROGRAM");
  const std::string& makeArgs =
    mf->GetSafeDefinition("CMAKE_CODEBLOCKS_MAKE_ARGUMENTS");

  cmXMLWriter xml(fout);
  xml.StartDocument();
  xml.StartElement("CodeBlocks_project_file");

  xml.StartElement("FileVersion");
  xml.Attribute("major", 1);
  xml.Attribute("minor", 6);
  xml.EndElement();

  xml.StartElement("Project");

  xml.StartElement("Option");
  xml.Attribute("title", lgs[0]->GetProjectName());
  xml.EndElement();

  xml.StartElement("Option");
  xml.Attribute("makefile_is_custom", 1);
  xml.EndElement();

  xml.StartElement("Option");
  xml.Attribute("compiler", compiler);
  xml.EndElement();

  // Now build a virtual tree
  tree.BuildVirtualFolder(xml);

  xml.StartElement("Build");

  this->AppendTarget(xml, "all", nullptr, make.c_str(), lgs[0],
                     compiler.c_str(), makeArgs);

  // add all executable and library targets and some of the GLOBAL
  // and UTILITY targets
  for (cmLocalGenerator* lg : lgs) {
    const std::vector<cmGeneratorTarget*>& targets = lg->GetGeneratorTargets();
    for (cmGeneratorTarget* target : targets) {
      std::string targetName = target->GetName();
      switch (target->GetType()) {
        case cmStateEnums::GLOBAL_TARGET: {
          // Only add the global targets from CMAKE_BINARY_DIR,
          // not from the subdirs
          if (lg->GetCurrentBinaryDirectory() == lg->GetBinaryDirectory()) {
            this->AppendTarget(xml, targetName, nullptr, make.c_str(), lg,
                               compiler.c_str(), makeArgs);
          }
        } break;
        case cmStateEnums::UTILITY:
          // Add all utility targets, except the Nightly/Continuous/
          // Experimental-"sub"targets as e.g. NightlyStart
          if (((targetName.find("Nightly") == 0) &&
               (targetName != "Nightly")) ||
              ((targetName.find("Continuous") == 0) &&
               (targetName != "Continuous")) ||
              ((targetName.find("Experimental") == 0) &&
               (targetName != "Experimental"))) {
            break;
          }

          this->AppendTarget(xml, targetName, nullptr, make.c_str(), lg,
                             compiler.c_str(), makeArgs);
          break;
        case cmStateEnums::EXECUTABLE:
        case cmStateEnums::STATIC_LIBRARY:
        case cmStateEnums::SHARED_LIBRARY:
        case cmStateEnums::MODULE_LIBRARY:
        case cmStateEnums::OBJECT_LIBRARY: {
          cmGeneratorTarget* gt = target;
          this->AppendTarget(xml, targetName, gt, make.c_str(), lg,
                             compiler.c_str(), makeArgs);
          std::string fastTarget = targetName;
          fastTarget += "/fast";
          this->AppendTarget(xml, fastTarget, gt, make.c_str(), lg,
                             compiler.c_str(), makeArgs);
        } break;
        default:
          break;
      }
    }
  }

  xml.EndElement(); // Build

  // Collect all used source files in the project.
  // Keep a list of C/C++ source files which might have an accompanying header
  // that should be looked for.
  typedef std::map<std::string, CbpUnit> all_files_map_t;
  all_files_map_t allFiles;
  std::vector<std::string> cFiles;

  auto cm = this->GlobalGenerator->GetCMakeInstance();

  for (cmLocalGenerator* lg : lgs) {
    cmMakefile* makefile = lg->GetMakefile();
    const std::vector<cmGeneratorTarget*>& targets = lg->GetGeneratorTargets();
    for (cmGeneratorTarget* target : targets) {
      switch (target->GetType()) {
        case cmStateEnums::EXECUTABLE:
        case cmStateEnums::STATIC_LIBRARY:
        case cmStateEnums::SHARED_LIBRARY:
        case cmStateEnums::MODULE_LIBRARY:
        case cmStateEnums::OBJECT_LIBRARY:
        case cmStateEnums::UTILITY: // can have sources since 2.6.3
        {
          std::vector<cmSourceFile*> sources;
          cmGeneratorTarget* gt = target;
          gt->GetSourceFiles(sources,
                             makefile->GetSafeDefinition("CMAKE_BUILD_TYPE"));
          for (cmSourceFile* s : sources) {
            // don't add source files from UTILITY target which have the
            // GENERATED property set:
            if (gt->GetType() == cmStateEnums::UTILITY &&
                s->GetIsGenerated()) {
              continue;
            }

            // check whether it is a C/C++/CUDA implementation file
            bool isCFile = false;
            std::string lang = s->GetLanguage();
            if (lang == "C" || lang == "CXX" || lang == "CUDA") {
              std::string const& srcext = s->GetExtension();
              isCFile = cm->IsSourceExtension(srcext);
            }

            std::string const& fullPath = s->GetFullPath();

            // Check file position relative to project root dir.
            const std::string& relative =
              cmSystemTools::RelativePath(lg->GetSourceDirectory(), fullPath);
            // Do not add this file if it has ".." in relative path and
            // if CMAKE_CODEBLOCKS_EXCLUDE_EXTERNAL_FILES variable is on.
            const bool excludeExternal =
              cmSystemTools::IsOn(lg->GetMakefile()->GetSafeDefinition(
                "CMAKE_CODEBLOCKS_EXCLUDE_EXTERNAL_FILES"));
            if (excludeExternal &&
                (relative.find("..") != std::string::npos)) {
              continue;
            }

            if (isCFile) {
              cFiles.push_back(fullPath);
            }

            CbpUnit& cbpUnit = allFiles[fullPath];
            cbpUnit.Targets.push_back(target);
          }
        }
        default: // intended fallthrough
          break;
      }
    }
  }

  std::vector<std::string> const& headerExts =
    this->GlobalGenerator->GetCMakeInstance()->GetHeaderExtensions();

  // The following loop tries to add header files matching to implementation
  // files to the project. It does that by iterating over all
  // C/C++ source files,
  // replacing the file name extension with ".h" and checks whether such a
  // file exists. If it does, it is inserted into the map of files.
  // A very similar version of that code exists also in the CodeLite
  // project generator.
  for (std::string const& fileName : cFiles) {
    std::string headerBasename = cmSystemTools::GetFilenamePath(fileName);
    headerBasename += "/";
    headerBasename += cmSystemTools::GetFilenameWithoutExtension(fileName);

    // check if there's a matching header around
    for (std::string const& ext : headerExts) {
      std::string hname = headerBasename;
      hname += ".";
      hname += ext;
      // if it's already in the set, don't check if it exists on disk
      if (allFiles.find(hname) != allFiles.end()) {
        break;
      }

      if (cmSystemTools::FileExists(hname)) {
        allFiles[hname].Targets = allFiles[fileName].Targets;
        break;
      }
    }
  }

  // insert all source files in the CodeBlocks project
  for (auto const& s : allFiles) {
    std::string const& unitFilename = s.first;
    CbpUnit const& unit = s.second;

    xml.StartElement("Unit");
    xml.Attribute("filename", unitFilename);

    for (cmGeneratorTarget const* tgt : unit.Targets) {
      xml.StartElement("Option");
      xml.Attribute("target", tgt->GetName());
      xml.EndElement();
    }

    xml.EndElement();
  }

  // Add CMakeLists.txt
  tree.BuildUnit(xml, std::string(mf->GetHomeDirectory()) + "/");

  xml.EndElement(); // Project
  xml.EndElement(); // CodeBlocks_project_file
  xml.EndDocument();
}